

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O1

future<int> __thiscall prometheus::Gateway::async_push(Gateway *this,HttpMethod method)

{
  element_type *peVar1;
  CollectableEntry *pCVar2;
  element_type *peVar3;
  Gateway *pGVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Gateway *pGVar6;
  int iVar7;
  _Atomic_word _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  _Result<int> *p_Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  undefined8 uVar15;
  undefined4 in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CollectableEntry *collectable;
  Gateway *pGVar16;
  _State_baseV2 *__tmp_1;
  undefined4 in_register_00000034;
  void *unaff_R14;
  _State_baseV2 *__tmp;
  _State_baseV2 *unaff_R15;
  _State_baseV2 *__tmp_2;
  bool bVar17;
  future<int> fVar18;
  shared_ptr<std::__future_base::_State_baseV2> __state_1;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> futures;
  string uri;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  TextSerializer serializer;
  undefined1 local_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  undefined1 local_118 [16];
  undefined8 uStack_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  Gateway *local_f0;
  __state_type local_e8;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> local_d8;
  long *local_b8;
  undefined4 local_ac;
  pthread_mutex_t *local_a8;
  Gateway *local_a0;
  Gateway *local_98;
  string local_90;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_70;
  __basic_future<int> local_58;
  Serializer local_48;
  _func_int **local_40 [2];
  
  pGVar16 = (Gateway *)CONCAT44(in_register_00000034,method);
  local_48._vptr_Serializer = (_func_int **)&PTR__Serializer_00125cf8;
  local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = (pthread_mutex_t *)&pGVar16->mutex_;
  local_ac = in_EDX;
  local_a0 = this;
  iVar7 = pthread_mutex_lock(local_a8);
  if (iVar7 != 0) {
    uVar15 = ::std::__throw_system_error(iVar7);
    ::std::__future_base::_State_baseV2::~_State_baseV2(unaff_R15);
    operator_delete(unaff_R14);
    if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
    }
    pthread_mutex_unlock(local_a8);
    ::std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector(&local_d8);
    _Unwind_Resume(uVar15);
  }
  pCVar2 = (pGVar16->collectables_).
           super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pGVar6 = pGVar16;
  pGVar4 = local_98;
  for (collectable = (pGVar16->collectables_).
                     super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; local_98 = pGVar6,
      collectable != pCVar2; collectable = collectable + 1) {
    p_Var14 = (collectable->first).
              super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var8 = p_Var14->_M_use_count;
      do {
        if (_Var8 == 0) {
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar7 = p_Var14->_M_use_count;
        bVar17 = _Var8 == iVar7;
        if (bVar17) {
          p_Var14->_M_use_count = _Var8 + 1;
          iVar7 = _Var8;
        }
        _Var8 = iVar7;
        UNLOCK();
      } while (!bVar17);
    }
    if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar17 = true;
    }
    else {
      bVar17 = p_Var14->_M_use_count == 0;
    }
    peVar3 = (collectable->first).
             super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0 && !bVar17) {
      (*peVar3->_vptr_Collectable[2])(&local_70);
      Serializer::Serialize_abi_cxx11_((string *)local_128,&local_48,&local_70);
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      p_Var9->_M_use_count = 1;
      p_Var9->_M_weak_count = 1;
      p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00125a10;
      p_Var10 = p_Var9 + 2;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)p_Var10;
      if (local_128 == (undefined1  [8])local_118) {
        p_Var10->_vptr__Sp_counted_base = (_func_int **)local_118._0_8_;
        p_Var9[2]._M_use_count = (int)CONCAT71(local_118._9_7_,local_118[8]);
        p_Var9[2]._M_weak_count = SUB74(local_118._9_7_,3);
      }
      else {
        p_Var9[1]._vptr__Sp_counted_base = (_func_int **)local_128;
        p_Var10->_vptr__Sp_counted_base = (_func_int **)local_118._0_8_;
      }
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var9[1]._M_use_count = _Stack_120._M_pi;
      getUri(&local_90,pGVar16,collectable);
      local_128._0_4_ = local_ac;
      _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_120,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
      local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_100 = p_Var9 + 1;
      local_f8 = p_Var9;
      local_f0 = pGVar16;
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
      p_Var11->_M_use_count = 1;
      p_Var11->_M_weak_count = 1;
      p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00125410;
      peVar1 = (element_type *)(p_Var11 + 1);
      p_Var11[2]._M_use_count = 0;
      p_Var11[1]._M_use_count = 0;
      p_Var11[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var11[1]._M_weak_count + 1) = 0;
      p_Var11[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[3]._M_use_count = 0;
      p_Var11[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00125460;
      p_Var12 = (_Result<int> *)operator_new(0x18);
      ::std::__future_base::_Result<int>::_Result(p_Var12);
      p_Var10 = local_f8;
      p_Var11[4]._vptr__Sp_counted_base = (_func_int **)p_Var12;
      p_Var11[4]._M_use_count = local_128._0_4_;
      p_Var11[5]._vptr__Sp_counted_base = (_func_int **)(p_Var11 + 6);
      if (_Stack_120._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8)) {
        p_Var11[6]._vptr__Sp_counted_base = (_func_int **)CONCAT71(local_118._9_7_,local_118[8]);
        p_Var11[6]._M_use_count = (undefined4)uStack_108;
        p_Var11[6]._M_weak_count = uStack_108._4_4_;
      }
      else {
        p_Var11[5]._vptr__Sp_counted_base = (_func_int **)_Stack_120._M_pi;
        p_Var11[6]._vptr__Sp_counted_base = (_func_int **)CONCAT71(local_118._9_7_,local_118[8]);
      }
      p_Var11[5]._M_use_count = local_118._0_4_;
      p_Var11[5]._M_weak_count = local_118._4_4_;
      local_118._0_8_ = (_func_int **)0x0;
      local_118[8] = '\0';
      p_Var11[7]._vptr__Sp_counted_base = (_func_int **)local_100;
      p_Var11[7]._M_use_count = 0;
      p_Var11[7]._M_weak_count = 0;
      local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var11[7]._M_use_count = p_Var10;
      local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var11[8]._vptr__Sp_counted_base = (_func_int **)local_f0;
      local_40[0] = (_func_int **)0x0;
      _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8);
      local_b8 = (long *)operator_new(0x20);
      *local_b8 = (long)&PTR___State_001254b8;
      local_b8[1] = (long)peVar1;
      local_b8[2] = (long)::std::__future_base::
                          _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:167:54)>_>,_int>
                          ::_M_run;
      local_b8[3] = 0;
      ::std::thread::_M_start_thread(local_40,&local_b8,0);
      if (local_b8 != (long *)0x0) {
        (**(code **)(*local_b8 + 8))();
      }
      _Var5._M_pi = local_e8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (p_Var11[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_00107f32;
      p_Var11[3]._vptr__Sp_counted_base = local_40[0];
      bVar17 = local_e8.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var11;
      if (bVar17) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
      }
      pGVar16 = local_98;
      if (local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
        p_Var13->_M_use_count = 1;
        p_Var13->_M_weak_count = 1;
        p_Var13->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001254f8;
        p_Var13[2]._M_use_count = 0;
        p_Var13[1]._M_use_count = 0;
        p_Var13[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var13[1]._M_weak_count + 1) = 0;
        p_Var13[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00125548;
        p_Var12 = (_Result<int> *)operator_new(0x18);
        ::std::__future_base::_Result<int>::_Result(p_Var12);
        pGVar16 = local_98;
        _Var5._M_pi = local_e8.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        p_Var11 = local_f8;
        p_Var13[3]._vptr__Sp_counted_base = (_func_int **)p_Var12;
        p_Var13[3]._M_use_count = local_128._0_4_;
        p_Var13[4]._vptr__Sp_counted_base = (_func_int **)(p_Var13 + 5);
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8);
        if (_Stack_120._M_pi == p_Var10) {
          p_Var13[5]._vptr__Sp_counted_base = (_func_int **)CONCAT71(local_118._9_7_,local_118[8]);
          p_Var13[5]._M_use_count = (undefined4)uStack_108;
          p_Var13[5]._M_weak_count = uStack_108._4_4_;
        }
        else {
          p_Var13[4]._vptr__Sp_counted_base = (_func_int **)_Stack_120._M_pi;
          p_Var13[5]._vptr__Sp_counted_base = (_func_int **)CONCAT71(local_118._9_7_,local_118[8]);
        }
        p_Var13[4]._M_use_count = local_118._0_4_;
        p_Var13[4]._M_weak_count = local_118._4_4_;
        local_118._0_8_ = (_func_int **)0x0;
        local_118[8] = '\0';
        p_Var13[6]._vptr__Sp_counted_base = (_func_int **)local_100;
        p_Var13[6]._M_use_count = 0;
        p_Var13[6]._M_weak_count = 0;
        local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var13[6]._M_use_count = p_Var11;
        local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var13[7]._vptr__Sp_counted_base = (_func_int **)local_f0;
        bVar17 = local_e8.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_120._M_pi = p_Var10;
        local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(p_Var13 + 1);
        local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var13;
        if (bVar17) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
        }
      }
      ::std::__basic_future<int>::__basic_future(&local_58,&local_e8);
      if (local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      ::std::vector<std::future<int>,std::allocator<std::future<int>>>::
      emplace_back<std::future<int>>
                ((vector<std::future<int>,std::allocator<std::future<int>>> *)&local_d8,
                 (future<int> *)&local_58);
      if (local_58._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
      }
      if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8)) {
        operator_delete(_Stack_120._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&local_70);
    }
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    pGVar6 = local_98;
    pGVar4 = local_98;
  }
  local_128 = (undefined1  [8])0x0;
  _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98 = pGVar4;
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00125590;
  p_Var14 = p_Var9 + 1;
  p_Var9[2]._M_use_count = 0;
  p_Var9[1]._M_use_count = 0;
  p_Var9[1]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var9[1]._M_weak_count + 1) = 0;
  p_Var9[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var9[3]._M_use_count = 0;
  p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001255e0;
  p_Var12 = (_Result<int> *)operator_new(0x18);
  ::std::__future_base::_Result<int>::_Result(p_Var12);
  p_Var9[4]._vptr__Sp_counted_base = (_func_int **)p_Var12;
  *(pointer *)&p_Var9[4]._M_use_count =
       local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  p_Var9[5]._vptr__Sp_counted_base =
       (_func_int **)
       local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)&p_Var9[5]._M_use_count =
       local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90._M_dataplus._M_p = (pointer)0x0;
  local_70.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  ((local_70.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
    ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p =
       (pointer)&PTR___State_00125638;
  ((local_70.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
    ._M_impl.super__Vector_impl_data._M_start)->name)._M_string_length = (size_type)p_Var14;
  ((local_70.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
    ._M_impl.super__Vector_impl_data._M_start)->name).field_2._M_allocated_capacity =
       (size_type)
       ::std::__future_base::
       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>
       ::_M_run;
  *(undefined8 *)
   ((long)&((local_70.
             super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
             ._M_impl.super__Vector_impl_data._M_start)->name).field_2 + 8) = 0;
  ::std::thread::_M_start_thread(&local_90,&local_70,0);
  if (local_70.
      super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(((local_70.
                   super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + 8))();
  }
  _Var5._M_pi = _Stack_120._M_pi;
  if (p_Var9[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var9[3]._vptr__Sp_counted_base = (_func_int **)local_90._M_dataplus._M_p;
    bVar17 = _Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128 = (undefined1  [8])p_Var14;
    _Stack_120._M_pi = p_Var9;
    if (bVar17) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
    }
    pGVar16 = local_a0;
    if (local_128 == (undefined1  [8])0x0) {
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var14->_M_use_count = 1;
      p_Var14->_M_weak_count = 1;
      p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00125678;
      p_Var14[2]._M_use_count = 0;
      p_Var14[1]._M_use_count = 0;
      p_Var14[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var14[1]._M_weak_count + 1) = 0;
      p_Var14[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_001256c8;
      p_Var12 = (_Result<int> *)operator_new(0x18);
      ::std::__future_base::_Result<int>::_Result(p_Var12);
      pGVar16 = local_a0;
      _Var5._M_pi = _Stack_120._M_pi;
      p_Var14[3]._vptr__Sp_counted_base = (_func_int **)p_Var12;
      *(pointer *)&p_Var14[3]._M_use_count =
           local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl
           .super__Vector_impl_data._M_start;
      p_Var14[4]._vptr__Sp_counted_base =
           (_func_int **)
           local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl
           .super__Vector_impl_data._M_finish;
      *(pointer *)&p_Var14[4]._M_use_count =
           local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar17 = _Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128 = (undefined1  [8])(p_Var14 + 1);
      _Stack_120._M_pi = p_Var14;
      if (bVar17) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
      }
    }
    ::std::__basic_future<int>::__basic_future
              ((__basic_future<int> *)pGVar16,(__state_type *)local_128);
    if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
    }
    pthread_mutex_unlock(local_a8);
    ::std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector(&local_d8);
    fVar18.super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    fVar18.super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pGVar16;
    return (future<int>)
           fVar18.super___basic_future<int>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_00107f32:
  ::std::terminate();
}

Assistant:

std::future<int> Gateway::async_push(detail::HttpMethod method) {
  const auto serializer = TextSerializer{};
  std::vector<std::future<int>> futures;

  std::lock_guard<std::mutex> lock{mutex_};
  for (auto& wcollectable : collectables_) {
    auto collectable = wcollectable.first.lock();
    if (!collectable) {
      continue;
    }

    auto metrics = collectable->Collect();
    auto body = std::make_shared<std::string>(serializer.Serialize(metrics));
    auto uri = getUri(wcollectable);

    futures.push_back(std::async(std::launch::async, [method, uri, body, this] {
      return curlWrapper_->performHttpRequest(method, uri, *body);
    }));
  }

  const auto reduceFutures = [](std::vector<std::future<int>> lfutures) {
    auto final_status_code = 200;

    for (auto& future : lfutures) {
      auto status_code = future.get();

      if (status_code < 100 || status_code >= 400) {
        final_status_code = status_code;
      }
    }

    return final_status_code;
  };

  return std::async(std::launch::async, reduceFutures, std::move(futures));
}